

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printUsage(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Program pro generovani a reseni sudoku.");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  Parametry:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "  i - interaktivni hra. pouzijte pokud nechcete aby program okamzite vyresil sudoku"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  f - filtr - pouze kontroluje spravnost vstupu");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  g - generator - pouze generuje nahodne sudoku");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  s - vyresi sudoku - vychozi rezim");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "  pri uvedeni kombinace techto parametru je chovani programu nedefinovano"
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"  Format parametru:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "  Parametry se zapisuji tak, ze pred ne uvedete pomlcku. Bez uvedeni pomlcky jsou brany jako nazvy souboru. "
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,
                           "  Prvni nazev souboru se bere jeko vstupni. pokud neni uveden, program vygeneruje nahodne sudoku."
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printUsage( void )
{
  cout << "Program pro generovani a reseni sudoku." << endl
  << "  Parametry:" << endl
  << "  i - interaktivni hra. pouzijte pokud nechcete aby program okamzite vyresil sudoku" << endl
  << "  f - filtr - pouze kontroluje spravnost vstupu" << endl
  << "  g - generator - pouze generuje nahodne sudoku" << endl
  << "  s - vyresi sudoku - vychozi rezim" << endl
  << "  pri uvedeni kombinace techto parametru je chovani programu nedefinovano" << endl
  << "  Format parametru:" << endl
  << "  Parametry se zapisuji tak, ze pred ne uvedete pomlcku. Bez uvedeni pomlcky jsou brany jako nazvy souboru. " << endl
  << "  Prvni nazev souboru se bere jeko vstupni. pokud neni uveden, program vygeneruje nahodne sudoku." << endl;
}